

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_NewScObjectNoCtorFull<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var pvVar1;
  
  pvVar1 = GetReg<unsigned_int>(this,playout->R1);
  pvVar1 = JavascriptOperators::NewScObjectNoCtorFull(pvVar1,*(ScriptContext **)(this + 0x78));
  SetReg<unsigned_int>(this,playout->R0,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObjectNoCtorFull(const unaligned T* playout)
    {
        Var function = GetReg(playout->R1);
        Var newObj = JavascriptOperators::NewScObjectNoCtorFull(function, GetScriptContext());
        SetReg(playout->R0, newObj);
    }